

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.hpp
# Opt level: O3

bool __thiscall MetaSim::Event::Cmp::operator()(Cmp *this,Event *e1,Event *e2)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  
  lVar1 = (e1->_time).v;
  lVar2 = (e2->_time).v;
  bVar3 = true;
  if (lVar2 <= lVar1) {
    if (lVar1 != lVar2) {
      return false;
    }
    if (e2->_priority <= e1->_priority) {
      if (e1->_priority != e2->_priority) {
        return false;
      }
      bVar3 = e1->_order < e2->_order;
    }
  }
  return bVar3;
}

Assistant:

inline Tick getTime() const {return _time;}